

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-feat.c
# Opt level: O3

_Bool project_f(source origin,wchar_t r,loc grid,wchar_t dam,wchar_t typ)

{
  project_feature_handler_context_t local_30;
  
  local_30.origin.which = origin.which;
  local_30.origin.what = origin.what;
  local_30.obvious = false;
  if (typ == L'>') {
    local_30.obvious = false;
  }
  else {
    local_30.r = r;
    local_30.grid = grid;
    local_30.dam = dam;
    local_30.type = typ;
    (*feature_handlers[typ])(&local_30);
  }
  return (_Bool)(local_30.obvious & 1);
}

Assistant:

bool project_f(struct source origin, int r, struct loc grid, int dam, int typ)
{
	bool obvious = false;

	project_feature_handler_context_t context = {
		origin,
		r,
		grid,
		dam,
		typ,
		obvious,
	};
	project_feature_handler_f feature_handler = feature_handlers[typ];

	if (feature_handler != NULL)
		feature_handler(&context);

	/* Return "Anything seen?" */
	return context.obvious;
}